

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

bool ImGui_ImplOpenGL3_Init(char *glsl_version)

{
  ImGuiIO *pIVar1;
  size_t sVar2;
  char *__src;
  
  pIVar1 = ImGui::GetIO();
  pIVar1->BackendRendererName = "imgui_impl_opengl3";
  __src = "#version 130";
  if (glsl_version != (char *)0x0) {
    __src = glsl_version;
  }
  strcpy(g_GlslVersionString,__src);
  sVar2 = strlen(g_GlslVersionString);
  (g_GlslVersionString + sVar2)[0] = '\n';
  (g_GlslVersionString + sVar2)[1] = '\0';
  return true;
}

Assistant:

bool    ImGui_ImplOpenGL3_Init(const char* glsl_version)
{
    ImGuiIO& io = ImGui::GetIO();
    io.BackendRendererName = "imgui_impl_opengl3";

    // Store GLSL version string so we can refer to it later in case we recreate shaders. Note: GLSL version is NOT the same as GL version. Leave this to NULL if unsure.
#ifdef USE_GL_ES3
    if (glsl_version == NULL)
        glsl_version = "#version 300 es";
#else
    if (glsl_version == NULL)
        glsl_version = "#version 130";
#endif
    IM_ASSERT((int)strlen(glsl_version) + 2 < IM_ARRAYSIZE(g_GlslVersionString));
    strcpy(g_GlslVersionString, glsl_version);
    strcat(g_GlslVersionString, "\n");

    return true;
}